

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecTree.c
# Opt level: O3

Vec_Int_t * Acec_TreeFindPoints(Gia_Man_t *p,Vec_Int_t *vAdds,Vec_Bit_t *vIgnore)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  Vec_Int_t *vMap;
  int *piVar5;
  int iVar6;
  uint uVar7;
  
  iVar6 = p->nObjs;
  iVar2 = iVar6 * 2;
  vMap = (Vec_Int_t *)malloc(0x10);
  iVar3 = 0x10;
  if (0xe < iVar2 - 1U) {
    iVar3 = iVar2;
  }
  vMap->nCap = iVar3;
  if (iVar3 == 0) {
    vMap->pArray = (int *)0x0;
    vMap->nSize = iVar2;
  }
  else {
    piVar5 = (int *)malloc((long)iVar3 << 2);
    vMap->pArray = piVar5;
    vMap->nSize = iVar2;
    if (piVar5 != (int *)0x0) {
      memset(piVar5,0xff,(long)iVar6 << 3);
    }
  }
  uVar4 = vAdds->nSize;
  if (0 < (int)uVar4) {
    uVar7 = 0;
    iVar6 = 0;
    do {
      if (vIgnore == (Vec_Bit_t *)0x0) {
        piVar5 = vAdds->pArray;
LAB_0068742c:
        Acec_TreeAddInOutPoint(vMap,piVar5[uVar7],iVar6,0);
        if (vAdds->nSize <= (int)(uVar7 + 1)) {
LAB_006874e7:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        Acec_TreeAddInOutPoint(vMap,vAdds->pArray[uVar7 + 1],iVar6,0);
        if (vAdds->nSize <= (int)(uVar7 + 2)) goto LAB_006874e7;
        Acec_TreeAddInOutPoint(vMap,vAdds->pArray[uVar7 + 2],iVar6,0);
        if (vAdds->nSize <= (int)(uVar7 + 3)) goto LAB_006874e7;
        Acec_TreeAddInOutPoint(vMap,vAdds->pArray[uVar7 + 3],iVar6,1);
        if (vAdds->nSize <= (int)(uVar7 + 4)) goto LAB_006874e7;
        Acec_TreeAddInOutPoint(vMap,vAdds->pArray[uVar7 + 4],iVar6,1);
        uVar4 = vAdds->nSize;
      }
      else {
        if ((int)uVar4 <= (int)(uVar7 + 3)) goto LAB_006874e7;
        piVar5 = vAdds->pArray;
        uVar1 = piVar5[uVar7 + 3];
        if (((int)uVar1 < 0) || (vIgnore->nSize <= (int)uVar1)) {
LAB_00687506:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecBit.h"
                        ,0x121,"int Vec_BitEntry(Vec_Bit_t *, int)");
        }
        if (((uint)vIgnore->pArray[uVar1 >> 5] >> (uVar1 & 0x1f) & 1) == 0) {
          if (uVar4 <= uVar7 + 4) goto LAB_006874e7;
          uVar1 = piVar5[uVar7 + 4];
          if (((int)uVar1 < 0) || ((uint)vIgnore->nSize <= uVar1)) goto LAB_00687506;
          if (((uint)vIgnore->pArray[uVar1 >> 5] >> (uVar1 & 0x1f) & 1) == 0) goto LAB_0068742c;
        }
      }
      iVar6 = iVar6 + 1;
      uVar7 = uVar7 + 6;
    } while ((int)uVar7 < (int)uVar4);
  }
  return vMap;
}

Assistant:

Vec_Int_t * Acec_TreeFindPoints( Gia_Man_t * p, Vec_Int_t * vAdds, Vec_Bit_t * vIgnore )
{
    Vec_Int_t * vMap = Vec_IntStartFull( 2*Gia_ManObjNum(p) );
    int i;
    for ( i = 0; 6*i < Vec_IntSize(vAdds); i++ )
    {
        if ( vIgnore && (Vec_BitEntry(vIgnore, Vec_IntEntry(vAdds, 6*i+3)) || Vec_BitEntry(vIgnore, Vec_IntEntry(vAdds, 6*i+4))) )
            continue;
        Acec_TreeAddInOutPoint( vMap, Vec_IntEntry(vAdds, 6*i+0), i, 0 );
        Acec_TreeAddInOutPoint( vMap, Vec_IntEntry(vAdds, 6*i+1), i, 0 );
        Acec_TreeAddInOutPoint( vMap, Vec_IntEntry(vAdds, 6*i+2), i, 0 );
        Acec_TreeAddInOutPoint( vMap, Vec_IntEntry(vAdds, 6*i+3), i, 1 );
        Acec_TreeAddInOutPoint( vMap, Vec_IntEntry(vAdds, 6*i+4), i, 1 );
    }
    return vMap;
}